

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadEqn.c
# Opt level: O2

void Io_ReadEqnStrCutAt(char *pStr,char *pStop,int fUniqueOnly,Vec_Ptr_t *vTokens)

{
  int iVar1;
  char *__s2;
  char *__s1;
  void **__ptr;
  int i;
  int i_00;
  ulong uVar2;
  
  vTokens->nSize = 0;
  do {
    __s2 = strtok(pStr,pStop);
    if (__s2 == (char *)0x0) {
      return;
    }
    if (fUniqueOnly == 0) {
      iVar1 = vTokens->nSize;
LAB_00299ec7:
      if (iVar1 == vTokens->nCap) {
        uVar2 = (ulong)(uint)(iVar1 * 2);
        if (iVar1 < 0x10) {
          uVar2 = 0x10;
        }
        __ptr = vTokens->pArray;
        if (iVar1 < (int)uVar2) {
          if (__ptr == (void **)0x0) {
            __ptr = (void **)malloc(uVar2 << 3);
          }
          else {
            __ptr = (void **)realloc(__ptr,uVar2 << 3);
            iVar1 = vTokens->nSize;
          }
          vTokens->pArray = __ptr;
          vTokens->nCap = (int)uVar2;
        }
      }
      else {
        __ptr = vTokens->pArray;
      }
      vTokens->nSize = iVar1 + 1;
      __ptr[iVar1] = __s2;
    }
    else {
      i_00 = 0;
      do {
        iVar1 = vTokens->nSize;
        if (iVar1 <= i_00) goto LAB_00299ec7;
        __s1 = (char *)Vec_PtrEntry(vTokens,i_00);
        iVar1 = strcmp(__s1,__s2);
        i_00 = i_00 + 1;
      } while (iVar1 != 0);
    }
    pStr = (char *)0x0;
  } while( true );
}

Assistant:

void Io_ReadEqnStrCutAt( char * pStr, char * pStop, int fUniqueOnly, Vec_Ptr_t * vTokens )
{
    char * pToken;
    Vec_PtrClear( vTokens );
    for ( pToken = strtok( pStr, pStop ); pToken; pToken = strtok( NULL, pStop ) )
        if ( !fUniqueOnly || Io_ReadEqnStrFind( vTokens, pToken ) == -1 )
            Vec_PtrPush( vTokens, pToken );
}